

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O3

dgAABBPointTree3d * __thiscall
dgConvexHull3d::BuildTree
          (dgConvexHull3d *this,dgAABBPointTree3d *parent,dgHullVertex *points,HaI32 count,
          HaI32 baseIndex,HaI8 **memoryPool,HaI32 *maxMemSize)

{
  dgHullVertex *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *pdVar11;
  dgAABBPointTree3d *pdVar12;
  uint uVar13;
  uint count_00;
  long lVar14;
  HaI32 i;
  int i_00;
  dgHullVertex *pdVar15;
  dgAABBPointTree3d *parent_00;
  HaI32 i_01;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double local_128;
  dgTemplateVector<double> local_c8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  double dStack_78;
  double dStack_70;
  undefined8 local_68;
  undefined1 local_58 [16];
  double local_48;
  double local_40;
  
  if (count == 0) {
    __assert_fail("count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                  ,0xaf,
                  "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                 );
  }
  if (count < 9) {
    parent_00 = (dgAABBPointTree3d *)*memoryPool;
    *memoryPool = (HaI8 *)&parent_00[1].m_box[1].super_dgTemplateVector<double>.m_y;
    *maxMemSize = *maxMemSize + -0x80;
    if (*maxMemSize < 0) {
      __assert_fail("maxMemSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0xb7,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    *(HaI32 *)&parent_00[1].m_box[0].super_dgTemplateVector<double>.m_x = count;
    if (count < 1) {
      auVar27._8_8_ = 0x430c6bf520000000;
      auVar27._0_8_ = 0x430c6bf520000000;
      auVar34._8_8_ = 0xc30c6bf520000000;
      auVar34._0_8_ = 0xc30c6bf520000000;
      dVar35 = 999999986991104.0;
      dVar33 = -999999986991104.0;
    }
    else {
      auVar27._8_8_ = 0x430c6bf520000000;
      auVar27._0_8_ = 0x430c6bf520000000;
      auVar34._8_8_ = 0xc30c6bf520000000;
      auVar34._0_8_ = 0xc30c6bf520000000;
      auVar20 = ZEXT816(0xc30c6bf520000000);
      auVar21 = ZEXT816(0x430c6bf520000000);
      pdVar11 = &(points->super_dgBigVector).super_dgTemplateVector<double>.m_z;
      uVar16 = 0;
      do {
        *(HaI32 *)((long)&parent_00[1].m_box[0].super_dgTemplateVector<double>.m_x + uVar16 * 4 + 4)
             = baseIndex + (int)uVar16;
        uVar16 = uVar16 + 1;
        auVar2._0_8_ = ((dgTemplateVector<double> *)(pdVar11 + -2))->m_x;
        auVar2._8_8_ = ((dgTemplateVector<double> *)(pdVar11 + -2))->m_y;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *pdVar11;
        pdVar11 = pdVar11 + 5;
        auVar27 = vminpd_avx(auVar27,auVar2);
        auVar34 = vmaxpd_avx(auVar34,auVar2);
        auVar21 = vminsd_avx(auVar21,auVar23);
        dVar35 = auVar21._0_8_;
        auVar20 = vmaxsd_avx(auVar20,auVar23);
        dVar33 = auVar20._0_8_;
      } while ((uint)count != uVar16);
    }
    parent_00->m_left = (dgAABBPointTree3d *)0x0;
    parent_00->m_right = (dgAABBPointTree3d *)0x0;
  }
  else {
    local_a8._8_8_ = 0x430c6bf520000000;
    local_a8._0_8_ = 0x430c6bf520000000;
    local_98._8_8_ = 0xc30c6bf520000000;
    local_98._0_8_ = 0xc30c6bf520000000;
    auVar20 = ZEXT816(0xc30c6bf520000000);
    auVar21 = ZEXT816(0x430c6bf520000000);
    dVar22 = 0.0;
    dVar24 = 0.0;
    dVar36 = 0.0;
    dVar25 = 0.0;
    dVar37 = 0.0;
    dVar38 = 0.0;
    lVar14 = 0;
    do {
      dVar26 = *(double *)
                ((long)&(points->super_dgBigVector).super_dgTemplateVector<double>.m_z + lVar14);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = dVar26;
      auVar32 = *(undefined1 (*) [16])
                 ((long)&(points->super_dgBigVector).super_dgTemplateVector<double>.m_x + lVar14);
      lVar14 = lVar14 + 0x28;
      auVar21 = vminsd_avx(auVar21,auVar28);
      local_a8 = vminpd_avx(local_a8,auVar32);
      local_98 = vmaxpd_avx(local_98,auVar32);
      dVar33 = auVar32._0_8_;
      dVar37 = dVar37 + dVar33;
      dVar35 = auVar32._8_8_;
      dVar38 = dVar38 + dVar35;
      auVar20 = vmaxsd_avx(auVar20,auVar28);
      dVar36 = dVar36 + dVar26;
      dVar22 = dVar33 * dVar33 + dVar22;
      dVar24 = dVar35 * dVar35 + dVar24;
      dVar25 = dVar26 * dVar26 + dVar25;
    } while ((ulong)(uint)count * 0x28 != lVar14);
    dVar33 = auVar20._0_8_;
    auVar32._0_8_ = dVar37 * dVar37;
    auVar32._8_8_ = dVar38 * dVar38;
    dVar35 = auVar21._0_8_;
    dVar26 = (double)count;
    auVar20._0_8_ = dVar22 * dVar26;
    auVar20._8_8_ = dVar24 * dVar26;
    auVar20 = vsubpd_avx(auVar20,auVar32);
    if (0x7fefffffffffffff < (auVar20._0_8_ & 0x7fffffffffffffff)) goto LAB_0085151a;
    dVar25 = dVar25 * dVar26 - dVar36 * dVar36;
    auVar29._8_8_ = auVar20._8_8_;
    auVar29._0_8_ = dVar25;
    auVar21._8_8_ = 0x7fffffffffffffff;
    auVar21._0_8_ = 0x7fffffffffffffff;
    auVar21 = vandpd_avx512vl(auVar29,auVar21);
    auVar9._8_8_ = 0x7fefffffffffffff;
    auVar9._0_8_ = 0x7fefffffffffffff;
    uVar16 = vpcmpgtq_avx512vl(auVar21,auVar9);
    if (((uVar16 & 3) >> 1 != 0) || ((uVar16 & 1) != 0)) goto LAB_0085151a;
    i_00 = 0;
    i_01 = 0;
    local_40 = 0.0;
    local_128 = -10000000000.0;
    local_58 = auVar20;
    local_48 = dVar25;
    do {
      pdVar11 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)local_58,i_00);
      if (local_128 < *pdVar11) {
        pdVar11 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)local_58,i_00);
        local_128 = *pdVar11;
        i_01 = i_00;
      }
      i_00 = i_00 + 1;
    } while (i_00 != 3);
    auVar10._8_8_ = dVar38;
    auVar10._0_8_ = dVar37;
    local_c8.m_z = 1.0 / (double)count;
    local_c8.m_x = local_c8.m_z * dVar37;
    auVar20 = vshufpd_avx(auVar10,auVar10,1);
    local_c8.m_y = local_c8.m_z * auVar20._0_8_;
    local_c8.m_z = local_c8.m_z * dVar36;
    local_c8.m_w = 0.0;
    if (((0x7fefffffffffffff < (long)ABS(local_c8.m_x)) ||
        (0x7fefffffffffffff < (long)ABS(local_c8.m_y))) ||
       (0x7fefffffffffffff < (long)ABS(local_c8.m_z))) goto LAB_0085151a;
    pdVar11 = dgTemplateVector<double>::operator[](&local_c8,i_01);
    dVar36 = *pdVar11;
    count_00 = 0;
    uVar17 = count - 1U;
    do {
      uVar16 = (ulong)(int)uVar17;
      uVar13 = count_00;
      if ((int)count_00 <= (int)uVar17) {
        uVar13 = uVar17 + 1;
        pdVar15 = points + (int)count_00;
        lVar14 = 0;
        do {
          pdVar11 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)pdVar15,i_01);
          if (dVar36 < *pdVar11) {
            uVar13 = count_00 - (int)lVar14;
            break;
          }
          lVar14 = lVar14 + -1;
          pdVar15 = pdVar15 + 1;
        } while (~uVar16 + (long)(int)count_00 != lVar14);
      }
      lVar14 = (long)(int)uVar13;
      uVar18 = uVar17;
      if ((int)uVar13 <= (int)uVar17) {
        lVar19 = uVar16 + 1;
        pdVar15 = points + uVar16;
        do {
          pdVar11 = dgTemplateVector<double>::operator[]((dgTemplateVector<double> *)pdVar15,i_01);
          uVar18 = uVar17;
          if (*pdVar11 < dVar36) break;
          uVar17 = uVar17 - 1;
          lVar19 = lVar19 + -1;
          pdVar15 = pdVar15 + -1;
          uVar18 = uVar13 - 1;
        } while (lVar14 < lVar19);
      }
      uVar17 = uVar18;
      count_00 = uVar13;
      if ((int)uVar13 < (int)uVar18) {
        count_00 = uVar13 + 1;
        uVar17 = uVar18 - 1;
        local_68 = *(undefined8 *)&points[lVar14].m_index;
        pdVar15 = points + lVar14;
        local_88 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x;
        dStack_80 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y;
        dStack_78 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_z;
        dStack_70 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_w;
        points[lVar14].m_index = points[(int)uVar18].m_index;
        pdVar15 = points + (int)uVar18;
        dVar25 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y;
        dVar22 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_z;
        dVar24 = (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_w;
        pdVar1 = points + lVar14;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_x =
             (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_y = dVar25;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_z = dVar22;
        (pdVar1->super_dgBigVector).super_dgTemplateVector<double>.m_w = dVar24;
        points[(int)uVar18].m_index = (HaI32)local_68;
        pdVar15 = points + (int)uVar18;
        (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_x = local_88;
        (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_y = dStack_80;
        (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_z = dStack_78;
        (pdVar15->super_dgBigVector).super_dgTemplateVector<double>.m_w = dStack_70;
      }
    } while ((int)count_00 <= (int)uVar17);
    parent_00 = (dgAABBPointTree3d *)*memoryPool;
    if (count_00 == 0) {
      count_00 = (uint)count >> 1;
    }
    if (count_00 == count - 1U) {
      count_00 = (uint)count >> 1;
    }
    *memoryPool = (HaI8 *)(parent_00 + 1);
    *maxMemSize = *maxMemSize + -0x58;
    if (*maxMemSize < 0) {
      __assert_fail("maxMemSize >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x10d,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    if (count_00 == 0) {
      __assert_fail("i0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x10f,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    if (count - count_00 == 0) {
      __assert_fail("count - i0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgConvexHull3d.cpp"
                    ,0x110,
                    "dgAABBPointTree3d *dgConvexHull3d::BuildTree(dgAABBPointTree3d *const, dgHullVertex *const, hacd::HaI32, hacd::HaI32, hacd::HaI8 **, hacd::HaI32 &) const"
                   );
    }
    pdVar12 = BuildTree(this,parent_00,points,count_00,baseIndex,memoryPool,maxMemSize);
    parent_00->m_left = pdVar12;
    pdVar12 = BuildTree(this,parent_00,points + (int)count_00,count - count_00,count_00 + baseIndex,
                        memoryPool,maxMemSize);
    parent_00->m_right = pdVar12;
    auVar34 = local_98;
    auVar27 = local_a8;
  }
  auVar3._8_8_ = 0xbf50624de0000000;
  auVar3._0_8_ = 0xbf50624de0000000;
  auVar20 = vaddpd_avx512vl(auVar27,auVar3);
  parent_00->m_parent = parent;
  if ((auVar20._0_8_ & 0x7fffffffffffffff) < 0x7ff0000000000000) {
    auVar30._8_8_ = auVar20._8_8_;
    auVar30._0_8_ = dVar35 + -0.0010000000474974513;
    auVar4._8_8_ = 0x7fffffffffffffff;
    auVar4._0_8_ = 0x7fffffffffffffff;
    auVar21 = vandpd_avx512vl(auVar30,auVar4);
    auVar5._8_8_ = 0x7fefffffffffffff;
    auVar5._0_8_ = 0x7fefffffffffffff;
    uVar16 = vpcmpgtq_avx512vl(auVar21,auVar5);
    if (((uVar16 & 3) >> 1 == 0) && ((uVar16 & 1) == 0)) {
      parent_00->m_box[0].super_dgTemplateVector<double>.m_x = (double)auVar20._0_8_;
      parent_00->m_box[0].super_dgTemplateVector<double>.m_y = (double)auVar20._8_8_;
      auVar6._8_8_ = 0x3f50624de0000000;
      auVar6._0_8_ = 0x3f50624de0000000;
      auVar20 = vaddpd_avx512vl(auVar34,auVar6);
      parent_00->m_box[0].super_dgTemplateVector<double>.m_z = dVar35 + -0.0010000000474974513;
      parent_00->m_box[0].super_dgTemplateVector<double>.m_w = 0.0;
      if ((auVar20._0_8_ & 0x7fffffffffffffff) < 0x7ff0000000000000) {
        auVar31._8_8_ = auVar20._8_8_;
        auVar31._0_8_ = dVar33 + 0.0010000000474974513;
        auVar7._8_8_ = 0x7fffffffffffffff;
        auVar7._0_8_ = 0x7fffffffffffffff;
        auVar21 = vandpd_avx512vl(auVar31,auVar7);
        auVar8._8_8_ = 0x7fefffffffffffff;
        auVar8._0_8_ = 0x7fefffffffffffff;
        uVar16 = vpcmpgtq_avx512vl(auVar21,auVar8);
        if (((uVar16 & 3) >> 1 == 0) && ((uVar16 & 1) == 0)) {
          parent_00->m_box[1].super_dgTemplateVector<double>.m_x = (double)auVar20._0_8_;
          parent_00->m_box[1].super_dgTemplateVector<double>.m_y = (double)auVar20._8_8_;
          parent_00->m_box[1].super_dgTemplateVector<double>.m_z = dVar33 + 0.0010000000474974513;
          parent_00->m_box[1].super_dgTemplateVector<double>.m_w = 0.0;
          return parent_00;
        }
      }
    }
  }
LAB_0085151a:
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
}

Assistant:

dgAABBPointTree3d* dgConvexHull3d::BuildTree (dgAABBPointTree3d* const parent, dgHullVertex* const points, hacd::HaI32 count, hacd::HaI32 baseIndex, hacd::HaI8** memoryPool, hacd::HaI32& maxMemSize) const
{
	dgAABBPointTree3d* tree = NULL;

	HACD_ASSERT (count);
	dgBigVector minP ( hacd::HaF32 (1.0e15f),  hacd::HaF32 (1.0e15f),  hacd::HaF32 (1.0e15f), hacd::HaF32 (0.0f)); 
	dgBigVector maxP (-hacd::HaF32 (1.0e15f), -hacd::HaF32 (1.0e15f), -hacd::HaF32 (1.0e15f), hacd::HaF32 (0.0f)); 
	if (count <= DG_VERTEX_CLUMP_SIZE_3D) {

		dgAABBPointTree3dClump* const clump = new (*memoryPool) dgAABBPointTree3dClump;
		*memoryPool += sizeof (dgAABBPointTree3dClump);
		maxMemSize -= sizeof (dgAABBPointTree3dClump);
		HACD_ASSERT (maxMemSize >= 0);


		clump->m_count = count;
		for (hacd::HaI32 i = 0; i < count; i ++) {
			clump->m_indices[i] = i + baseIndex;

			const dgBigVector& p = points[i];
			minP.m_x = GetMin (p.m_x, minP.m_x); 
			minP.m_y = GetMin (p.m_y, minP.m_y); 
			minP.m_z = GetMin (p.m_z, minP.m_z); 

			maxP.m_x = GetMax (p.m_x, maxP.m_x); 
			maxP.m_y = GetMax (p.m_y, maxP.m_y); 
			maxP.m_z = GetMax (p.m_z, maxP.m_z); 
		}

		clump->m_left = NULL;
		clump->m_right = NULL;
		tree = clump;

	} else {
		dgBigVector median (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		dgBigVector varian (hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f), hacd::HaF32 (0.0f));
		for (hacd::HaI32 i = 0; i < count; i ++) {

			const dgBigVector& p = points[i];
			minP.m_x = GetMin (p.m_x, minP.m_x); 
			minP.m_y = GetMin (p.m_y, minP.m_y); 
			minP.m_z = GetMin (p.m_z, minP.m_z); 

			maxP.m_x = GetMax (p.m_x, maxP.m_x); 
			maxP.m_y = GetMax (p.m_y, maxP.m_y); 
			maxP.m_z = GetMax (p.m_z, maxP.m_z); 

			median += p;
			varian += p.CompProduct (p);
		}

		varian = varian.Scale (hacd::HaF32 (count)) - median.CompProduct(median);
		hacd::HaI32 index = 0;
		hacd::HaF64 maxVarian = hacd::HaF64 (-1.0e10f);
		for (hacd::HaI32 i = 0; i < 3; i ++) {
			if (varian[i] > maxVarian) {
				index = i;
				maxVarian = varian[i];
			}
		}
		dgBigVector center = median.Scale (hacd::HaF64 (1.0f) / hacd::HaF64 (count));

		hacd::HaF64 test = center[index];

		hacd::HaI32 i0 = 0;
		hacd::HaI32 i1 = count - 1;
		do {    
			for (; i0 <= i1; i0 ++) {
				hacd::HaF64 val = points[i0][index];
				if (val > test) {
					break;
				}
			}

			for (; i1 >= i0; i1 --) {
				hacd::HaF64 val = points[i1][index];
				if (val < test) {
					break;
				}
			}

			if (i0 < i1)	{
				Swap(points[i0], points[i1]);
				i0++; 
				i1--;
			}
		} while (i0 <= i1);

		if (i0 == 0){
			i0 = count / 2;
		}
		if (i0 == (count - 1)){
			i0 = count / 2;
		}

		tree = new (*memoryPool) dgAABBPointTree3d;
		*memoryPool += sizeof (dgAABBPointTree3d);
		maxMemSize -= sizeof (dgAABBPointTree3d);
		HACD_ASSERT (maxMemSize >= 0);

		HACD_ASSERT (i0);
		HACD_ASSERT (count - i0);

		tree->m_left = BuildTree (tree, points, i0, baseIndex, memoryPool, maxMemSize);
		tree->m_right = BuildTree (tree, &points[i0], count - i0, i0 + baseIndex, memoryPool, maxMemSize);
	}

	HACD_ASSERT (tree);
	tree->m_parent = parent;
	tree->m_box[0] = minP - dgBigVector (hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0f));
	tree->m_box[1] = maxP + dgBigVector (hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0e-3f), hacd::HaF64 (1.0f));
	return tree;
}